

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

size_t build_certificate_verify_signdata
                 (uint8_t *data,st_ptls_key_schedule_t *sched,char *context_string)

{
  size_t sVar1;
  ulong uVar2;
  size_t datalen;
  char *context_string_local;
  st_ptls_key_schedule_t *sched_local;
  uint8_t *data_local;
  
  memset(data,0x20,0x40);
  sVar1 = strlen(context_string);
  memcpy(data + 0x40,context_string,sVar1 + 1);
  sVar1 = strlen(context_string);
  (*sched->msghash->final)(sched->msghash,data + sVar1 + 0x41,PTLS_HASH_FINAL_MODE_SNAPSHOT);
  uVar2 = sched->algo->digest_size + sVar1 + 0x41;
  if (uVar2 < 0xe3) {
    return uVar2;
  }
  __assert_fail("datalen <= PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/../lib/picotls.c"
                ,0x2f6,
                "size_t build_certificate_verify_signdata(uint8_t *, struct st_ptls_key_schedule_t *, const char *)"
               );
}

Assistant:

static size_t build_certificate_verify_signdata(uint8_t *data, struct st_ptls_key_schedule_t *sched, const char *context_string)
{
    size_t datalen = 0;

    memset(data + datalen, 32, 64);
    datalen += 64;
    memcpy(data + datalen, context_string, strlen(context_string) + 1);
    datalen += strlen(context_string) + 1;
    sched->msghash->final(sched->msghash, data + datalen, PTLS_HASH_FINAL_MODE_SNAPSHOT);
    datalen += sched->algo->digest_size;
    assert(datalen <= PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE);

    return datalen;
}